

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_filename.c
# Opt level: O0

void test_read_format_gtar_filename(void)

{
  char *refname3;
  char *refname2;
  char *refname1;
  char *in_stack_00000400;
  
  extract_reference_file(in_stack_00000400);
  test_read_format_gtar_filename_eucJP_UTF8(refname3);
  test_read_format_gtar_filename_eucJP_CP932(refname3);
  extract_reference_file(in_stack_00000400);
  test_read_format_gtar_filename_CP866_KOI8R(refname3);
  test_read_format_gtar_filename_CP866_UTF8(refname3);
  test_read_format_gtar_filename_CP866_CP1251(refname3);
  test_read_format_gtar_filename_CP866_CP1251_win(refname3);
  extract_reference_file(in_stack_00000400);
  test_read_format_gtar_filename_KOI8R_CP866(refname3);
  test_read_format_gtar_filename_KOI8R_UTF8(refname3);
  test_read_format_gtar_filename_KOI8R_CP1251(refname3);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_filename)
{
	const char *refname1 = "test_read_format_gtar_filename_eucjp.tar.Z";
	const char *refname2 = "test_read_format_gtar_filename_cp866.tar.Z";
	const char *refname3 = "test_read_format_gtar_filename_koi8r.tar.Z";

	extract_reference_file(refname1);
	test_read_format_gtar_filename_eucJP_UTF8(refname1);
	test_read_format_gtar_filename_eucJP_CP932(refname1);

	extract_reference_file(refname2);
	test_read_format_gtar_filename_CP866_KOI8R(refname2);
	test_read_format_gtar_filename_CP866_UTF8(refname2);
	test_read_format_gtar_filename_CP866_CP1251(refname2);
	test_read_format_gtar_filename_CP866_CP1251_win(refname2);

	extract_reference_file(refname3);
	test_read_format_gtar_filename_KOI8R_CP866(refname3);
	test_read_format_gtar_filename_KOI8R_UTF8(refname3);
	test_read_format_gtar_filename_KOI8R_CP1251(refname3);
}